

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.cpp
# Opt level: O0

void __thiscall CNetAddr::SetLegacyIPv6(CNetAddr *this,Span<const_unsigned_char> ipv6)

{
  long lVar1;
  bool bVar2;
  size_t sVar3;
  prevector<16U,_unsigned_char,_unsigned_int,_int> *in_RDI;
  long in_FS_OFFSET;
  size_t skip;
  Span<const_unsigned_char> *in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  size_type n;
  array<unsigned_char,_6UL> *prefix;
  prevector<16U,_unsigned_char,_unsigned_int,_int> *this_00;
  
  n = (size_type)((ulong)in_stack_ffffffffffffffc0 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  sVar3 = Span<const_unsigned_char>::size(in_stack_ffffffffffffffb8);
  if (sVar3 != 0x10) {
    __assert_fail("ipv6.size() == ADDR_IPV6_SIZE",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/netaddress.cpp"
                  ,0x8b,"void CNetAddr::SetLegacyIPv6(Span<const uint8_t>)");
  }
  prefix = (array<unsigned_char,_6UL> *)0x0;
  bVar2 = util::HasPrefix<Span<unsigned_char_const>,12ul>
                    ((Span<const_unsigned_char> *)this_00,(array<unsigned_char,_12UL> *)0x0);
  if (bVar2) {
    *(undefined4 *)&in_RDI[1]._union = 1;
    prefix = (array<unsigned_char,_6UL> *)0xc;
  }
  else {
    bVar2 = util::HasPrefix<Span<unsigned_char_const>,6ul>
                      ((Span<const_unsigned_char> *)this_00,prefix);
    if (bVar2) {
      *(undefined4 *)&in_RDI[1]._union = 2;
      prevector<16U,_unsigned_char,_unsigned_int,_int>::assign
                (in_RDI,n,(uchar *)in_stack_ffffffffffffffb8);
      goto LAB_0197c89e;
    }
    bVar2 = util::HasPrefix<Span<unsigned_char_const>,6ul>
                      ((Span<const_unsigned_char> *)this_00,prefix);
    if (bVar2) {
      *(undefined4 *)&in_RDI[1]._union = 6;
      prefix = (array<unsigned_char,_6UL> *)0x6;
    }
    else {
      *(undefined4 *)&in_RDI[1]._union = 2;
    }
  }
  Span<const_unsigned_char>::begin(in_stack_ffffffffffffffb8);
  Span<const_unsigned_char>::end(in_stack_ffffffffffffffb8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::assign<const_unsigned_char_*>
            (this_00,prefix->_M_elems,(uchar *)in_RDI);
LAB_0197c89e:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CNetAddr::SetLegacyIPv6(Span<const uint8_t> ipv6)
{
    assert(ipv6.size() == ADDR_IPV6_SIZE);

    size_t skip{0};

    if (HasPrefix(ipv6, IPV4_IN_IPV6_PREFIX)) {
        // IPv4-in-IPv6
        m_net = NET_IPV4;
        skip = sizeof(IPV4_IN_IPV6_PREFIX);
    } else if (HasPrefix(ipv6, TORV2_IN_IPV6_PREFIX)) {
        // TORv2-in-IPv6 (unsupported). Unserialize as !IsValid(), thus ignoring them.
        // Mimic a default-constructed CNetAddr object which is !IsValid() and thus
        // will not be gossiped, but continue reading next addresses from the stream.
        m_net = NET_IPV6;
        m_addr.assign(ADDR_IPV6_SIZE, 0x0);
        return;
    } else if (HasPrefix(ipv6, INTERNAL_IN_IPV6_PREFIX)) {
        // Internal-in-IPv6
        m_net = NET_INTERNAL;
        skip = sizeof(INTERNAL_IN_IPV6_PREFIX);
    } else {
        // IPv6
        m_net = NET_IPV6;
    }

    m_addr.assign(ipv6.begin() + skip, ipv6.end());
}